

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

uint32_t spvtools::opt::analysis::AddNewConstInGlobals(IRContext *context,uint32_t const_value)

{
  pointer pOVar1;
  TypeManager *this;
  uint32_t res_id;
  uint32_t ty_id;
  Instruction *this_00;
  Type *type;
  size_type __dnew;
  string message;
  undefined1 local_a8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_88;
  char *local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  res_id = Module::TakeNextIdBound
                     ((context->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((context->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_a8._0_8_ = (_func_int **)0x25;
    local_78 = local_70 + 8;
    local_78 = (char *)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)local_a8);
    local_70._8_8_ = local_a8._0_8_;
    builtin_strncpy(local_78,"ID overflow. Try running compact-ids.",0x25);
    local_70._0_8_ = local_a8._0_8_;
    local_78[local_a8._0_8_] = '\0';
    local_a8._0_8_ = (_func_int **)0x0;
    local_a8._8_8_ = 0;
    local_a8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_a8._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&context->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_a8,local_78);
    if (local_78 != local_70 + 8) {
      operator_delete(local_78,local_70._8_8_ + 1);
    }
  }
  this_00 = (Instruction *)operator_new(0x70);
  if ((context->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(context);
  }
  this = (context->type_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  type = TypeManager::GetUIntType(this);
  ty_id = TypeManager::GetTypeInstruction(this,type);
  local_a8._24_8_ = local_a8 + 0x10;
  local_a8._0_8_ = &PTR__SmallVector_00b15d78;
  local_88._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_a8._16_4_ = const_value;
  local_a8._8_8_ = 1;
  local_78 = (char *)CONCAT44(local_78._4_4_,9);
  local_70._0_8_ = &PTR__SmallVector_00b15d78;
  local_70._8_8_ = 0;
  local_70._24_8_ = local_70 + 0x10;
  local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_70,(SmallVector<unsigned_int,_2UL> *)local_a8);
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  pOVar1 = local_48.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
  (local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
   _M_impl.super__Vector_impl_data._M_start)->type = (spv_operand_type_t)local_78;
  ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start)->words)._vptr_SmallVector =
       (_func_int **)&PTR__SmallVector_00b15d78;
  ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start)->words).size_ = 0;
  ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start)->words).small_data_ =
       (uint *)((local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start)->words).buffer;
  ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start)->words).large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&(local_48.
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start)->words,
             (SmallVector<unsigned_int,_2UL> *)local_70);
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = pOVar1;
  Instruction::Instruction(this_00,context,OpConstant,ty_id,res_id,&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  local_70._0_8_ = &PTR__SmallVector_00b15d78;
  if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50,local_50._M_head_impl);
  }
  local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a8._0_8_ = &PTR__SmallVector_00b15d78;
  if (local_88._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_88,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_88._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((context->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_)
              .super_IntrusiveList<spvtools::opt::Instruction>,this_00);
  IRContext::InvalidateAnalyses(context,kAnalysisConstants);
  IRContext::InvalidateAnalyses(context,kAnalysisBegin);
  return res_id;
}

Assistant:

uint32_t AddNewConstInGlobals(IRContext* context, uint32_t const_value) {
  uint32_t id = context->TakeNextId();
  std::unique_ptr<Instruction> new_const(new Instruction(
      context, spv::Op::OpConstant, context->get_type_mgr()->GetUIntTypeId(),
      id,
      {
          {spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
           {const_value}},
      }));
  context->module()->AddGlobalValue(std::move(new_const));
  context->InvalidateAnalyses(IRContext::kAnalysisConstants);
  context->InvalidateAnalyses(IRContext::kAnalysisDefUse);
  return id;
}